

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O1

void __thiscall TeamCityTestOutput::printEscaped(TeamCityTestOutput *this,char *s)

{
  undefined1 *puVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  undefined1 *puVar5;
  uint uVar6;
  byte *pbVar7;
  undefined8 uStack_38;
  
  uVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),*s);
  if (*s != '\0') {
    puVar1 = (undefined1 *)((long)&uStack_38 + 7);
    pbVar7 = (byte *)(s + 1);
    uStack_38 = uVar4;
    do {
      uVar6 = (uint)uVar4 & 0xff;
      uVar3 = uStack_38._6_2_;
      puVar5 = puVar1;
      if (uVar6 < 0x5b) {
        if (uVar6 == 10) {
          uStack_38._0_7_ = CONCAT25(0x6e7c,(undefined5)uStack_38);
        }
        else {
          if (uVar6 != 0xd) {
            if (uVar6 == 0x27) goto LAB_0013c62c;
            goto LAB_0013c65b;
          }
          uStack_38._0_7_ = CONCAT25(0x727c,(undefined5)uStack_38);
        }
      }
      else if ((uVar6 - 0x5b < 0x22) && ((0x200000005U >> ((ulong)(uVar6 - 0x5b) & 0x3f) & 1) != 0))
      {
LAB_0013c62c:
        uStack_38._0_6_ = CONCAT15(0x7c,(undefined5)uStack_38);
        uStack_38._0_7_ = CONCAT16((char)uVar4,(undefined6)uStack_38);
      }
      else {
LAB_0013c65b:
        uStack_38._0_6_ = CONCAT15((char)uVar4,(undefined5)uStack_38);
        uStack_38 = CONCAT26(uVar3,(undefined6)uStack_38);
        puVar5 = (undefined1 *)((long)&uStack_38 + 6);
      }
      *puVar5 = 0;
      (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[10])
                (this,(long)&uStack_38 + 5);
      bVar2 = *pbVar7;
      uVar4 = (ulong)bVar2;
      pbVar7 = pbVar7 + 1;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

void TeamCityTestOutput::printEscaped(const char* s)
{
    while (*s) {
        char str[3];
        if ((*s == '\'') || (*s == '|') || (*s == '[') || (*s == ']')) {
            str[0] = '|';
            str[1] = *s;
            str[2] = 0;
        } else if (*s == '\r') {
            str[0] = '|';
            str[1] = 'r';
            str[2] = 0;
        } else if (*s == '\n') {
            str[0] = '|';
            str[1] = 'n';
            str[2] = 0;
        } else {
            str[0] = *s;
            str[1] = 0;
        }
        printBuffer(str);
        s++;
    }
}